

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeGetSpacePreserve(xmlNode *cur)

{
  int iVar1;
  xmlChar *in_RAX;
  xmlChar *space;
  
  if ((cur == (xmlNode *)0x0) || (space = in_RAX, cur->type != XML_ELEMENT_NODE)) {
    return -1;
  }
  do {
    if (cur == (xmlNode *)0x0) {
      return -1;
    }
    iVar1 = xmlNodeGetAttrValue(cur,"space",(xmlChar *)"http://www.w3.org/XML/1998/namespace",&space
                               );
    if (iVar1 < 0) {
      return -1;
    }
    if (space != (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(space,(xmlChar *)"preserve");
      if (iVar1 != 0) {
        (*xmlFree)(space);
        return 1;
      }
      iVar1 = xmlStrEqual(space,"default");
      (*xmlFree)(space);
      if (iVar1 != 0) {
        return 0;
      }
    }
    cur = cur->parent;
  } while( true );
}

Assistant:

int
xmlNodeGetSpacePreserve(const xmlNode *cur) {
    xmlChar *space;
        int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(-1);

    while (cur != NULL) {
	res = xmlNodeGetAttrValue(cur, BAD_CAST "space", XML_XML_NAMESPACE,
                                  &space);
        if (res < 0)
            return(-1);
	if (space != NULL) {
	    if (xmlStrEqual(space, BAD_CAST "preserve")) {
		xmlFree(space);
		return(1);
	    }
	    if (xmlStrEqual(space, BAD_CAST "default")) {
		xmlFree(space);
		return(0);
	    }
	    xmlFree(space);
	}

	cur = cur->parent;
    }

    return(-1);
}